

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Args::Args(Args *this,int argc,char **argv)

{
  bool bVar1;
  Argument *pAVar2;
  shared_ptr<std::optional<ritobin::BinUnhasher>_> local_5f8 [2];
  DynamicFormat *format;
  iterator __end2;
  iterator __begin2;
  span<const_ritobin::io::DynamicFormat_*const,_18446744073709551615UL> *__range2;
  runtime_error *err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string_view local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string_view local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  string_view local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string_view local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string_view local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  string_view local_480;
  string_view local_470;
  string_view local_460;
  string_view local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  string local_418;
  path local_3f8;
  path local_3d0;
  path local_3a8;
  path local_380;
  string local_358;
  any local_338;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  any local_2d8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  any local_278;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  any local_240;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  bool local_1d9;
  any local_1d8;
  bool local_1c1;
  any local_1c0;
  allocator<char> local_1a9;
  string local_1a8;
  bool local_181;
  any local_180;
  bool local_169;
  any local_168;
  allocator<char> local_151;
  string local_150;
  bool local_129;
  any local_128;
  bool local_111;
  any local_110;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  ArgumentParser program;
  char **argv_local;
  int argc_local;
  Args *this_local;
  
  this->keep_hashed = false;
  this->recursive = false;
  this->log = false;
  program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::__cxx11::string::string((string *)&this->dir);
  std::__cxx11::string::string((string *)&this->input_file);
  std::__cxx11::string::string((string *)&this->output_file);
  std::__cxx11::string::string((string *)&this->input_dir);
  std::__cxx11::string::string((string *)&this->output_dir);
  std::__cxx11::string::string((string *)&this->input_format);
  std::__cxx11::string::string((string *)&this->output_format);
  std::shared_ptr<std::optional<ritobin::BinUnhasher>_>::shared_ptr(&this->unhasher);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"ritobin",&local_c1);
  argparse::ArgumentParser::ArgumentParser((ArgumentParser *)local_a0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-k","--keep-hashed");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"do not run unhasher",&local_f9);
  pAVar2 = argparse::Argument::help(pAVar2,&local_f8);
  local_111 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_110,&local_111);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_110);
  local_129 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_128,&local_129);
  argparse::Argument::implicit_value(pAVar2,&local_128);
  std::any::~any(&local_128);
  std::any::~any(&local_110);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-r","--recursive");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"run on directory",&local_151);
  pAVar2 = argparse::Argument::help(pAVar2,&local_150);
  local_169 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_168,&local_169);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_168);
  local_181 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_180,&local_181);
  argparse::Argument::implicit_value(pAVar2,&local_180);
  std::any::~any(&local_180);
  std::any::~any(&local_168);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-v","--verbose");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"log more",&local_1a9);
  pAVar2 = argparse::Argument::help(pAVar2,&local_1a8);
  local_1c1 = false;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1c0,&local_1c1);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_1c0);
  local_1d9 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_1d8,&local_1d9);
  argparse::Argument::implicit_value(pAVar2,&local_1d8);
  std::any::~any(&local_1d8);
  std::any::~any(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_a0,"input");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"input file or directory",&local_201);
  pAVar2 = argparse::Argument::help(pAVar2,&local_200);
  argparse::Argument::required(pAVar2);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_a0,"output");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"output file or directory",&local_229);
  pAVar2 = argparse::Argument::help(pAVar2,&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_261);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_240,&local_260);
  argparse::Argument::default_value(pAVar2,&local_240);
  std::any::~any(&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-i","--input-format");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_278,&local_298);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"format of input file",&local_2c1);
  argparse::Argument::help(pAVar2,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::any::~any(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-o","--output-format");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_2f9);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_2d8,&local_2f8);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"format of output file",&local_321);
  argparse::Argument::help(pAVar2,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::any::~any(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_a0,"-d","--dir-hashes");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_3d0,
             (char **)program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
             auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_3f8,(char (*) [7])0x1b0160,auto_format);
  std::filesystem::__cxx11::operator/(&local_380,&local_3a8,&local_3f8);
  std::filesystem::__cxx11::path::generic_string(&local_358,&local_380);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_338,&local_358);
  pAVar2 = argparse::Argument::default_value(pAVar2,&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"directory containing hashes",&local_419);
  argparse::Argument::help(pAVar2,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::any::~any(&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::filesystem::__cxx11::path::~path(&local_380);
  std::filesystem::__cxx11::path::~path(&local_3f8);
  std::filesystem::__cxx11::path::~path(&local_3a8);
  std::filesystem::__cxx11::path::~path(&local_3d0);
  argparse::ArgumentParser::parse_args
            ((ArgumentParser *)local_a0,argc,
             (char **)program.mArgumentMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_450,"--dir-hashes");
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_440,(ArgumentParser *)local_a0,local_450);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->dir,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_460,"--keep-hashed");
  bVar1 = argparse::ArgumentParser::get<bool>((ArgumentParser *)local_a0,local_460);
  this->keep_hashed = bVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_470,"--recursive")
  ;
  bVar1 = argparse::ArgumentParser::get<bool>((ArgumentParser *)local_a0,local_470);
  this->recursive = bVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,"--verbose");
  bVar1 = argparse::ArgumentParser::get<bool>((ArgumentParser *)local_a0,local_480);
  this->log = bVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4b0,"--input-format");
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_4a0,(ArgumentParser *)local_a0,local_4b0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->input_format,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_4e0,"--output-format");
  argparse::ArgumentParser::get<std::__cxx11::string>
            (&local_4d0,(ArgumentParser *)local_a0,local_4e0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->output_format,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  if ((this->recursive & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_570,"input");
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_560,(ArgumentParser *)local_a0,local_570);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->input_file,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&err,"output");
    argparse::ArgumentParser::get<std::__cxx11::string>(&local_590,(ArgumentParser *)local_a0,_err);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_file,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_510,"input");
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_500,(ArgumentParser *)local_a0,local_510);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->input_dir,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_540,"output");
    argparse::ArgumentParser::get<std::__cxx11::string>
              (&local_530,(ArgumentParser *)local_a0,local_540);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_dir,&local_530);
    std::__cxx11::string::~string((string *)&local_530);
  }
  std::make_shared<std::optional<ritobin::BinUnhasher>,std::nullopt_t_const&>
            ((nullopt_t *)local_5f8);
  std::shared_ptr<std::optional<ritobin::BinUnhasher>_>::operator=(&this->unhasher,local_5f8);
  std::shared_ptr<std::optional<ritobin::BinUnhasher>_>::~shared_ptr(local_5f8);
  argparse::ArgumentParser::~ArgumentParser((ArgumentParser *)local_a0);
  return;
}

Assistant:

Args(int argc, char** argv) {
        argparse::ArgumentParser program("ritobin");
        program.add_argument("-k", "--keep-hashed")
                .help("do not run unhasher")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-r", "--recursive")
                .help("run on directory")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("-v", "--verbose")
                .help("log more")
                .default_value(false)
                .implicit_value(true);
        program.add_argument("input")
                .help("input file or directory")
                .required();
        program.add_argument("output")
                .help("output file or directory")
                .default_value(std::string(""));
        program.add_argument("-i", "--input-format")
                .default_value(std::string(""))
                .help("format of input file");
        program.add_argument("-o", "--output-format")
                .default_value(std::string(""))
                .help("format of output file");
        program.add_argument("-d", "--dir-hashes")
                .default_value((fs::path(argv[0]).parent_path() / "hashes").generic_string())
                .help("directory containing hashes");
        try {
            program.parse_args(argc, argv);
            dir =  program.get<std::string>("--dir-hashes");
            keep_hashed = program.get<bool>("--keep-hashed");
            recursive = program.get<bool>("--recursive");
            log = program.get<bool>("--verbose");
            input_format = program.get<std::string>("--input-format");
            output_format = program.get<std::string>("--output-format");
            if (recursive) {
                input_dir = program.get<std::string>("input");
                output_dir = program.get<std::string>("output");
            } else {
                input_file = program.get<std::string>("input");
                output_file = program.get<std::string>("output");
            }
        } catch (const std::runtime_error& err) {
            std::cerr << err.what() << std::endl;
            std::cerr << program << std::endl;
            std::cerr << "Formats:" << std::endl;
            for (auto format: ritobin::io::DynamicFormat::list()) {
                std::cerr << "\t- " << format->name() << std::endl;
            }
            exit(-1);
        }
        unhasher = std::make_shared<std::optional<BinUnhasher>>(std::nullopt);
    }